

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts2-lace.c
# Opt level: O1

void lace_parseParams(int *argc_p,char **argv)

{
  int iVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  
  iVar1 = *argc_p;
  iVar2 = 1;
  if (iVar1 != 1) {
    iVar5 = 1;
    do {
      __s2 = argv[iVar5];
      iVar2 = strcmp("-w",__s2);
      if (iVar2 == 0) {
        piVar6 = &_lace_workers;
      }
      else {
        iVar3 = strcmp("-q",__s2);
        iVar2 = iVar5;
        if (iVar3 != 0) break;
        piVar6 = &_lace_dqsize;
      }
      iVar2 = iVar5 + 1;
      if (iVar2 == iVar1) break;
      iVar2 = atoi(argv[iVar2]);
      *piVar6 = iVar2;
      iVar5 = iVar5 + 2;
      iVar2 = iVar5;
    } while (iVar5 != iVar1);
  }
  iVar5 = iVar1 - iVar2;
  if (iVar5 != 0 && iVar2 <= iVar1) {
    lVar4 = 0;
    do {
      argv[lVar4 + 1] = argv[iVar2 + lVar4];
      lVar4 = lVar4 + 1;
    } while ((ulong)(iVar5 + 1) - 1 != lVar4);
  }
  *argc_p = iVar5 + 1;
  return;
}

Assistant:

void lace_parseParams(int* argc_p, char *argv[])
{
  int argc = *argc_p;

  int i=1;

  while (1) {
    if (i == argc) break;
    if (strcmp("-w", argv[i])==0) {
      i++;
      if (i == argc) break;
      _lace_workers = atoi(argv[i]);
    }
    else if (strcmp("-q", argv[i])==0) {
      i++;
      if (i == argc) break;
      _lace_dqsize = atoi(argv[i]);
    }
    else break;
    i++;
  }

  int j;
  for (j=1;j <= argc - i;j++) argv[j] = argv[i - 1 + j];
  *argc_p = argc - i + 1;
}